

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O2

void __thiscall TTD::TTDCompareMap::DiagnosticAssert(TTDCompareMap *this,bool condition)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,condition) != 0) {
    return;
  }
  if (this->CurrentPath != (TTDComparePath *)0x0) {
    Output::Print(L"Snap1 ptrid: *0x%I64x\n",this->CurrentH1Ptr);
    Output::Print(L"Snap2 ptrid: *0x%I64x\n",this->CurrentH2Ptr);
    TTDComparePath::WritePathToConsole(this->CurrentPath,this->Context,true,this->PathBuffer,0x100);
  }
  TTDAbort_unrecoverable_error("Diagnostic compare assertion failed!!!");
}

Assistant:

void TTDCompareMap::DiagnosticAssert(bool condition)
    {
        if(!condition)
        {
            if(this->CurrentPath != nullptr)
            {
                Output::Print(_u("Snap1 ptrid: *0x%I64x\n"), this->CurrentH1Ptr);
                Output::Print(_u("Snap2 ptrid: *0x%I64x\n"), this->CurrentH2Ptr);
                this->CurrentPath->WritePathToConsole(this->Context, true, this->PathBuffer, PATH_BUFFER_COUNT);
            }
        }

        TTDAssert(condition, "Diagnostic compare assertion failed!!!");
    }